

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O0

void __thiscall Clique::add(Clique *this,size_t index)

{
  uint uVar1;
  size_type sVar2;
  ostream *this_00;
  void *this_01;
  unsigned_long *puVar3;
  ulong in_RSI;
  long in_RDI;
  AlignmentRecord *ap;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 val;
  size_type in_stack_ffffffffffffffb8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  ulong local_28;
  ulong local_20;
  AlignmentRecord *local_18;
  ulong local_10;
  
  val = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  local_10 = in_RSI;
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                      (in_RDI + 0x20));
  if (sVar2 <= in_RSI) {
    std::operator<<((ostream *)&std::cout,"Clique::add failure from clique: ");
    this_00 = ::operator<<((ostream *)this,(Clique *)index);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    in_stack_ffffffffffffffc0 =
         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::operator<<((ostream *)&std::cout,"Capacity: ");
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (*(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> **)
                        (in_RDI + 0x20));
    this_01 = (void *)std::ostream::operator<<(in_stack_ffffffffffffffc0,sVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)val);
  local_18 = (AlignmentRecord *)
             (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))(*(long **)(in_RDI + 0x28),local_10);
  puVar3 = (unsigned_long *)(in_RDI + 8);
  uVar1 = AlignmentRecord::getIntervalStart(local_18);
  local_20 = (ulong)uVar1;
  puVar3 = std::min<unsigned_long>(puVar3,&local_20);
  *(unsigned_long *)(in_RDI + 8) = *puVar3;
  puVar3 = (unsigned_long *)(in_RDI + 0x10);
  uVar1 = AlignmentRecord::getIntervalEnd(local_18);
  local_28 = (ulong)uVar1;
  puVar3 = std::max<unsigned_long>(puVar3,&local_28);
  *(unsigned_long *)(in_RDI + 0x10) = *puVar3;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void Clique::add(size_t index) {
	if (index >= alignment_set->size()) {
		cout << "Clique::add failure from clique: " << *this <<endl;
		cout << "Capacity: " << alignment_set->size() << endl;
	}
	alignment_set->set(index, true);
	const AlignmentRecord& ap = parent.getAlignmentByIndex(index);
	leftmost_segment_start = min(leftmost_segment_start,(size_t)ap.getIntervalStart());
	rightmost_segment_end = max(rightmost_segment_end,(size_t)ap.getIntervalEnd());
	alignment_count += 1;
}